

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O0

optional<long_long> QNetworkHeadersPrivate::toInt(QByteArrayView value)

{
  bool bVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  long in_FS_OFFSET;
  optional<long_long> oVar3;
  qint64 res;
  bool ok;
  int in_stack_ffffffffffffffac;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  QByteArrayView *in_stack_ffffffffffffffb8;
  _Storage<long_long,_true> local_18;
  undefined1 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QByteArrayView::empty((QByteArrayView *)0x1f580a);
  if (bVar1) {
    std::optional<long_long>::optional((optional<long_long> *)&local_18);
    uVar2 = extraout_RDX;
  }
  else {
    QByteArrayView::toLongLong
              (in_stack_ffffffffffffffb8,
               (bool *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffac);
    std::optional<long_long>::optional((optional<long_long> *)&local_18);
    uVar2 = extraout_RDX_00;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  oVar3.super__Optional_base<long_long,_true,_true>._M_payload.
  super__Optional_payload_base<long_long>._9_7_ = (undefined7)((ulong)uVar2 >> 8);
  oVar3.super__Optional_base<long_long,_true,_true>._M_payload.
  super__Optional_payload_base<long_long>._M_engaged = (bool)local_10;
  oVar3.super__Optional_base<long_long,_true,_true>._M_payload.
  super__Optional_payload_base<long_long>._M_payload._M_value = local_18._M_value;
  return (optional<long_long>)
         oVar3.super__Optional_base<long_long,_true,_true>._M_payload.
         super__Optional_payload_base<long_long>;
}

Assistant:

std::optional<qint64> QNetworkHeadersPrivate::toInt(QByteArrayView value)
{
    if (value.empty())
        return std::nullopt;

    bool ok;
    qint64 res = value.toLongLong(&ok);
    if (ok)
        return res;
    return std::nullopt;
}